

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# controls.c
# Opt level: O1

void ctrl_Init(void)

{
  char *in_RDX;
  char *description;
  char *description_00;
  char *description_01;
  char *description_02;
  char *description_03;
  char *description_04;
  char *description_05;
  char *description_06;
  char *description_07;
  char *description_08;
  char *description_09;
  char *description_10;
  char *description_11;
  char *description_12;
  char *description_13;
  char *description_14;
  
  DefaultKeys[0] = '\0';
  DefaultKeys[1] = 'q';
  DefaultKeys[2] = 'r';
  DefaultKeys[3] = 'h';
  DefaultKeys[4] = 's';
  DefaultKeys[5] = ' ';
  DefaultKeys[6] = 'p';
  DefaultKeys[7] = 'a';
  DefaultKeys[8] = 'b';
  DefaultKeys[9] = 'c';
  DefaultKeys[10] = 'd';
  DefaultKeys[0xb] = 'i';
  DefaultKeys[0xc] = 'j';
  DefaultKeys[0xd] = 'k';
  DefaultKeys[0xe] = 'l';
  DefaultKeys[0xf] = 'm';
  DefaultKeys[0x10] = 'n';
  DefaultKeys[0x11] = 'o';
  DefaultKeys[0x12] = '.';
  DefaultKeys[0x13] = '+';
  SecondaryKeys[0] = '\0';
  SecondaryKeys[1] = 'x';
  SecondaryKeys[2] = 'r';
  SecondaryKeys[3] = '?';
  SecondaryKeys[4] = 's';
  SecondaryKeys[5] = ' ';
  SecondaryKeys[6] = '\n';
  SecondaryKeys[7] = 'a';
  SecondaryKeys[8] = 'b';
  SecondaryKeys[9] = 'c';
  SecondaryKeys[10] = 'd';
  SecondaryKeys[0xb] = '1';
  SecondaryKeys[0xc] = '2';
  SecondaryKeys[0xd] = '3';
  SecondaryKeys[0xe] = '4';
  SecondaryKeys[0xf] = '5';
  SecondaryKeys[0x10] = '6';
  SecondaryKeys[0x11] = '7';
  SecondaryKeys[0x12] = '.';
  SecondaryKeys[0x13] = '+';
  builtin_strncpy(HelpString,"  double key .. move to color stack or cancel action\n",0x36);
  FormatCmdHelp((char *)0x5,0x103066,in_RDX);
  FormatCmdHelp((char *)0x6,0x103075,description);
  FormatCmdHelp((char *)0x7,0x103097,description_00);
  FormatCmdHelp((char *)0x8,0x1030ae,description_01);
  FormatCmdHelp((char *)0x9,0x1030c5,description_02);
  FormatCmdHelp((char *)0xa,0x1030db,description_03);
  FormatCmdHelp((char *)0xb,0x1030f4,description_04);
  FormatCmdHelp((char *)0xc,0x103108,description_05);
  FormatCmdHelp((char *)0xd,0x10311c,description_06);
  FormatCmdHelp((char *)0xe,0x103130,description_07);
  FormatCmdHelp((char *)0xf,0x103144,description_08);
  FormatCmdHelp((char *)0x10,0x103158,description_09);
  FormatCmdHelp((char *)0x11,0x10316c,description_10);
  FormatCmdHelp((char *)0x4,0x103180,description_11);
  FormatCmdHelp((char *)0x3,0x103199,description_12);
  FormatCmdHelp((char *)0x2,0x1031a8,description_13);
  FormatCmdHelp((char *)0x1,0x1031b5,description_14);
  return;
}

Assistant:

void ctrl_Init(void)
{
  DefaultKeys[CMD_NONE] = '\0';
  DefaultKeys[CMD_EXIT] = KEY_PRI_EXIT_GAME;
  DefaultKeys[CMD_RESET] = KEY_PRI_NEW_GAME;
  DefaultKeys[CMD_HELP] = KEY_PRI_SHOW_HELP;
  DefaultKeys[CMD_SCHEME] = KEY_PRI_CHANGE_SCHEME;
  DefaultKeys[CMD_NEXT] = KEY_PRI_NEXT_CARD;
  DefaultKeys[CMD_PACK] = KEY_PRI_SELECT_PACK;
  DefaultKeys[CMD_COLOR0] = KEY_PRI_SELECT_COLOR1;
  DefaultKeys[CMD_COLOR1] = KEY_PRI_SELECT_COLOR2;
  DefaultKeys[CMD_COLOR2] = KEY_PRI_SELECT_COLOR3;
  DefaultKeys[CMD_COLOR3] = KEY_PRI_SELECT_COLOR4;
  DefaultKeys[CMD_DESK0] = KEY_PRI_SELECT_DESK1;
  DefaultKeys[CMD_DESK1] = KEY_PRI_SELECT_DESK2;
  DefaultKeys[CMD_DESK2] = KEY_PRI_SELECT_DESK3;
  DefaultKeys[CMD_DESK3] = KEY_PRI_SELECT_DESK4;
  DefaultKeys[CMD_DESK4] = KEY_PRI_SELECT_DESK5;
  DefaultKeys[CMD_DESK5] = KEY_PRI_SELECT_DESK6;
  DefaultKeys[CMD_DESK6] = KEY_PRI_SELECT_DESK7;
  DefaultKeys[CMD_LAZY] = '.';
  DefaultKeys[CMD_HACK] = '+';

  SecondaryKeys[CMD_NONE] = '\0';
  SecondaryKeys[CMD_EXIT] = KEY_SEC_EXIT_GAME;
  SecondaryKeys[CMD_RESET] = KEY_SEC_NEW_GAME;
  SecondaryKeys[CMD_HELP] = KEY_SEC_SHOW_HELP;
  SecondaryKeys[CMD_SCHEME] = KEY_SEC_CHANGE_SCHEME;
  SecondaryKeys[CMD_NEXT] = KEY_SEC_NEXT_CARD;
  SecondaryKeys[CMD_PACK] = KEY_SEC_SELECT_PACK;
  SecondaryKeys[CMD_COLOR0] = KEY_SEC_SELECT_COLOR1;
  SecondaryKeys[CMD_COLOR1] = KEY_SEC_SELECT_COLOR2;
  SecondaryKeys[CMD_COLOR2] = KEY_SEC_SELECT_COLOR3;
  SecondaryKeys[CMD_COLOR3] = KEY_SEC_SELECT_COLOR4;
  SecondaryKeys[CMD_DESK0] = KEY_SEC_SELECT_DESK1;
  SecondaryKeys[CMD_DESK1] = KEY_SEC_SELECT_DESK2;
  SecondaryKeys[CMD_DESK2] = KEY_SEC_SELECT_DESK3;
  SecondaryKeys[CMD_DESK3] = KEY_SEC_SELECT_DESK4;
  SecondaryKeys[CMD_DESK4] = KEY_SEC_SELECT_DESK5;
  SecondaryKeys[CMD_DESK5] = KEY_SEC_SELECT_DESK6;
  SecondaryKeys[CMD_DESK6] = KEY_SEC_SELECT_DESK7;
  SecondaryKeys[CMD_LAZY] = '.';
  SecondaryKeys[CMD_HACK] = '+';

  GenerateHelp();
}